

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O2

Result wabt::GenerateNames(Module *module,NameOpts opts)

{
  pointer ppIVar1;
  Import *base;
  pointer ppEVar2;
  Export *pEVar3;
  pointer ppGVar4;
  pointer ppTVar5;
  pointer ppFVar6;
  pointer ppTVar7;
  pointer ppMVar8;
  pointer ppTVar9;
  pointer ppDVar10;
  pointer ppEVar11;
  uint uVar12;
  Index IVar13;
  Result RVar14;
  FuncImport *pFVar15;
  TagImport *pTVar16;
  MemoryImport *pMVar17;
  GlobalImport *pGVar18;
  TableImport *pTVar19;
  Func *pFVar20;
  char *prefix;
  size_t i;
  pointer ppIVar21;
  ulong uVar22;
  string *str;
  pointer ppEVar23;
  long lVar24;
  BindingHash *bindings;
  NameGenerator generator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_to_name;
  string new_name;
  
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameGenerator_00194e28
  ;
  generator.module_ = (Module *)0x0;
  ExprVisitor::ExprVisitor(&generator.visitor_,(Delegate *)&generator);
  generator.label_count_ = 0;
  generator.num_func_imports_ = 0;
  generator.num_table_imports_ = 0;
  generator.num_memory_imports_ = 0;
  generator.num_global_imports_ = 0;
  generator.num_tag_imports_ = 0;
  ppIVar1 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  generator.module_ = module;
  generator.opts_ = opts;
  for (ppIVar21 = (module->imports).
                  super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppIVar21 != ppIVar1; ppIVar21 = ppIVar21 + 1) {
    base = *ppIVar21;
    switch(base->kind_) {
    case First:
      pFVar15 = cast<wabt::FuncImport,wabt::Import>(base);
      if (pFVar15 != (FuncImport *)0x0) {
        bindings = &(generator.module_)->func_bindings;
        str = &(pFVar15->func).name;
        IVar13 = generator.num_func_imports_;
        generator.num_func_imports_ = generator.num_func_imports_ + 1;
LAB_0012dc00:
        if (IVar13 == 0xffffffff) {
          __assert_fail("index != kInvalidIndex",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/generate-names.cc"
                        ,0x14c,
                        "Result wabt::(anonymous namespace)::NameGenerator::VisitImport(Import *)");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &index_to_name,&base->module_name,'.');
        std::operator+(&new_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &index_to_name,&base->field_name);
        std::__cxx11::string::_M_dispose();
        anon_unknown_17::NameGenerator::MaybeUseAndBindName
                  (&generator,bindings,new_name._M_dataplus._M_p,IVar13,str);
        std::__cxx11::string::_M_dispose();
      }
      break;
    case Table:
      pTVar19 = cast<wabt::TableImport,wabt::Import>(base);
      if (pTVar19 != (TableImport *)0x0) {
        bindings = &(generator.module_)->table_bindings;
        str = &(pTVar19->table).name;
        IVar13 = generator.num_table_imports_;
        generator.num_table_imports_ = generator.num_table_imports_ + 1;
        goto LAB_0012dc00;
      }
      break;
    case Memory:
      pMVar17 = cast<wabt::MemoryImport,wabt::Import>(base);
      if (pMVar17 != (MemoryImport *)0x0) {
        bindings = &(generator.module_)->memory_bindings;
        str = &(pMVar17->memory).name;
        IVar13 = generator.num_memory_imports_;
        generator.num_memory_imports_ = generator.num_memory_imports_ + 1;
        goto LAB_0012dc00;
      }
      break;
    case Global:
      pGVar18 = cast<wabt::GlobalImport,wabt::Import>(base);
      if (pGVar18 != (GlobalImport *)0x0) {
        bindings = &(generator.module_)->global_bindings;
        str = &(pGVar18->global).name;
        IVar13 = generator.num_global_imports_;
        generator.num_global_imports_ = generator.num_global_imports_ + 1;
        goto LAB_0012dc00;
      }
      break;
    case Last:
      pTVar16 = cast<wabt::TagImport,wabt::Import>(base);
      if (pTVar16 != (TagImport *)0x0) {
        bindings = &(generator.module_)->tag_bindings;
        str = &(pTVar16->tag).name;
        IVar13 = generator.num_tag_imports_;
        generator.num_tag_imports_ = generator.num_tag_imports_ + 1;
        goto LAB_0012dc00;
      }
    }
  }
  ppEVar2 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar23 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar23 != ppEVar2; ppEVar23 = ppEVar23 + 1) {
    pEVar3 = *ppEVar23;
    switch(pEVar3->kind) {
    case First:
      pFVar20 = Module::GetFunc(generator.module_,&pEVar3->var);
      if (pFVar20 != (Func *)0x0) {
        IVar13 = Module::GetFuncIndex(generator.module_,&pEVar3->var);
        lVar24 = 0x1b0;
LAB_0012dda8:
        anon_unknown_17::NameGenerator::MaybeUseAndBindName
                  (&generator,
                   (BindingHash *)((long)&((generator.module_)->loc).filename._M_len + lVar24),
                   (pEVar3->name)._M_dataplus._M_p,IVar13,&pFVar20->name);
      }
      break;
    case Table:
      pFVar20 = (Func *)Module::GetTable(generator.module_,&pEVar3->var);
      if (pFVar20 != (Func *)0x0) {
        IVar13 = Module::GetTableIndex(generator.module_,&pEVar3->var);
        lVar24 = 0x290;
        goto LAB_0012dda8;
      }
      break;
    case Memory:
      pFVar20 = (Func *)Module::GetMemory(generator.module_,&pEVar3->var);
      if (pFVar20 != (Func *)0x0) {
        IVar13 = Module::GetMemoryIndex(generator.module_,&pEVar3->var);
        lVar24 = 0x2c8;
        goto LAB_0012dda8;
      }
      break;
    case Global:
      pFVar20 = (Func *)Module::GetGlobal(generator.module_,&pEVar3->var);
      if (pFVar20 != (Func *)0x0) {
        IVar13 = Module::GetGlobalIndex(generator.module_,&pEVar3->var);
        lVar24 = 0x1e8;
        goto LAB_0012dda8;
      }
      break;
    case Last:
      pFVar20 = (Func *)Module::GetTag(generator.module_,&pEVar3->var);
      if (pFVar20 != (Func *)0x0) {
        IVar13 = Module::GetTagIndex(generator.module_,&pEVar3->var);
        lVar24 = 0x178;
        goto LAB_0012dda8;
      }
    }
  }
  uVar12 = 0;
  while( true ) {
    ppGVar4 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->globals).
                      super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppGVar4 >> 3) <= (ulong)uVar12)
    break;
    anon_unknown_17::NameGenerator::MaybeGenerateAndBindName
              (&generator,&(generator.module_)->global_bindings,"g",uVar12,&ppGVar4[uVar12]->name);
    uVar12 = uVar12 + 1;
  }
  uVar12 = 0;
  while( true ) {
    ppTVar5 = (module->types).
              super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->types).
                      super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >> 3) <=
        (ulong)uVar12) break;
    anon_unknown_17::NameGenerator::MaybeGenerateAndBindName
              (&generator,&(generator.module_)->type_bindings,"t",uVar12,&ppTVar5[uVar12]->name);
    uVar12 = uVar12 + 1;
  }
  uVar12 = 0;
  do {
    ppFVar6 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->funcs).
                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3) <= (ulong)uVar12)
    break;
    pFVar20 = ppFVar6[uVar12];
    anon_unknown_17::NameGenerator::MaybeGenerateAndBindName
              (&generator,&(generator.module_)->func_bindings,"f",uVar12,&pFVar20->name);
    index_to_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    index_to_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    index_to_name.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    IVar13 = Func::GetNumParamsAndLocals(pFVar20);
    MakeTypeBindingReverseMapping((ulong)IVar13,&pFVar20->bindings,&index_to_name);
    lVar24 = 0;
    for (uVar22 = 0;
        uVar22 < (ulong)((long)index_to_name.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)index_to_name.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar22 = uVar22 + 1)
    {
      if (*(long *)((long)&(index_to_name.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar24)
          == 0) {
        prefix = "p";
        if (((ulong)((long)(pFVar20->decl).sig.param_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pFVar20->decl).sig.param_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3 & 0xffffffff) <= uVar22) {
          prefix = "l";
        }
        new_name._M_dataplus._M_p = (pointer)&new_name.field_2;
        new_name._M_string_length = 0;
        new_name.field_2._M_local_buf[0] = '\0';
        anon_unknown_17::NameGenerator::GenerateAndBindName
                  (&generator,&pFVar20->bindings,prefix,(Index)uVar22,&new_name);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&((index_to_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar24)
                  );
        std::__cxx11::string::_M_dispose();
      }
      lVar24 = lVar24 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&index_to_name);
    generator._120_8_ = generator._120_8_ & 0xffffffff00000000;
    RVar14 = ExprVisitor::VisitFunc(&generator.visitor_,pFVar20);
    uVar12 = uVar12 + 1;
  } while (RVar14.enum_ != Error);
  uVar12 = 0;
  while( true ) {
    ppTVar7 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppTVar7 >> 3) <= (ulong)uVar12)
    break;
    anon_unknown_17::NameGenerator::MaybeGenerateAndBindName
              (&generator,&(generator.module_)->table_bindings,"T",uVar12,&ppTVar7[uVar12]->name);
    uVar12 = uVar12 + 1;
  }
  uVar12 = 0;
  while( true ) {
    ppMVar8 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppMVar8 >> 3) <= (ulong)uVar12)
    break;
    anon_unknown_17::NameGenerator::MaybeGenerateAndBindName
              (&generator,&(generator.module_)->memory_bindings,"M",uVar12,&ppMVar8[uVar12]->name);
    uVar12 = uVar12 + 1;
  }
  uVar12 = 0;
  while( true ) {
    ppTVar9 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9 >> 3) <=
        (ulong)uVar12) break;
    anon_unknown_17::NameGenerator::MaybeGenerateAndBindName
              (&generator,&(generator.module_)->tag_bindings,"e",uVar12,&ppTVar9[uVar12]->name);
    uVar12 = uVar12 + 1;
  }
  uVar12 = 0;
  while( true ) {
    ppDVar10 = (module->data_segments).
               super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->data_segments).
                      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar10 >> 3) <=
        (ulong)uVar12) break;
    anon_unknown_17::NameGenerator::MaybeGenerateAndBindName
              (&generator,&(generator.module_)->data_segment_bindings,"d",uVar12,
               &ppDVar10[uVar12]->name);
    uVar12 = uVar12 + 1;
  }
  uVar12 = 0;
  while( true ) {
    ppEVar11 = (module->elem_segments).
               super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->elem_segments).
                      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar11 >> 3) <=
        (ulong)uVar12) break;
    anon_unknown_17::NameGenerator::MaybeGenerateAndBindName
              (&generator,&(generator.module_)->elem_segment_bindings,"e",uVar12,
               &ppEVar11[uVar12]->name);
    uVar12 = uVar12 + 1;
  }
  generator.module_ = (Module *)0x0;
  anon_unknown_17::NameGenerator::~NameGenerator(&generator);
  return (Result)Ok;
}

Assistant:

Result GenerateNames(Module* module, NameOpts opts) {
  NameGenerator generator(opts);
  return generator.VisitModule(module);
}